

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::~hash_map(hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            *this)

{
  clear(this);
  vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
  ::~vector(&this->m_values);
  return;
}

Assistant:

inline ~hash_map() {
    clear();
  }